

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinusExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::MinusExpression::derivative(MinusExpression *this,VariableExpressionPtr *variable)

{
  element_type *peVar1;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  BaseExpressionPtr BVar2;
  MinusExpression *arg;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_ffffffffffffffc8;
  
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1176fd);
  arg = (MinusExpression *)&stack0xffffffffffffffc0;
  (*peVar1->_vptr_BaseExpression[1])(arg,peVar1,in_RDX);
  operator-<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>(in_stack_ffffffffffffffc8);
  BaseExpression::makePtr<Kandinsky::MinusExpression>(arg);
  ~MinusExpression((MinusExpression *)0x117743);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x11774d);
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr MinusExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(- m_arg->derivative(variable));
    }